

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

void VulkanUtilities::SetObjectName
               (VkDevice device,uint64_t objectHandle,VkObjectType objectType,char *name)

{
  Char *Message;
  undefined1 local_78 [8];
  string msg;
  undefined4 local_50;
  VkResult res;
  VkDebugUtilsObjectNameInfoEXT ObjectNameInfo;
  char *name_local;
  VkObjectType objectType_local;
  uint64_t objectHandle_local;
  VkDevice device_local;
  
  if ((((anonymous_namespace)::SetDebugUtilsObjectNameEXT != (code *)0x0) && (name != (char *)0x0))
     && (*name != '\0')) {
    ObjectNameInfo.pObjectName = name;
    memset(&local_50,0,0x28);
    local_50 = 0x3b9cbe00;
    ObjectNameInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    ObjectNameInfo._4_4_ = 0;
    ObjectNameInfo.objectHandle = (uint64_t)ObjectNameInfo.pObjectName;
    ObjectNameInfo.pNext._0_4_ = objectType;
    ObjectNameInfo._16_8_ = objectHandle;
    msg.field_2._12_4_ = (*(anonymous_namespace)::SetDebugUtilsObjectNameEXT)(device,&local_50);
    if (msg.field_2._12_4_ != 0) {
      Diligent::FormatString<char[26],char[18]>
                ((string *)local_78,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"res == VK_SUCCESS",(char (*) [18])name);
      Message = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (Message,"SetObjectName",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0x152);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void SetObjectName(VkDevice device, uint64_t objectHandle, VkObjectType objectType, const char* name)
{
    // Check for valid function pointer (may not be present if not running in a debug mode)
    if (SetDebugUtilsObjectNameEXT == nullptr || name == nullptr || name[0] == '\0')
        return;

    VkDebugUtilsObjectNameInfoEXT ObjectNameInfo{};
    ObjectNameInfo.sType        = VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_NAME_INFO_EXT;
    ObjectNameInfo.pNext        = nullptr;
    ObjectNameInfo.objectType   = objectType;
    ObjectNameInfo.objectHandle = objectHandle;
    ObjectNameInfo.pObjectName  = name;

    VkResult res = SetDebugUtilsObjectNameEXT(device, &ObjectNameInfo);
    VERIFY_EXPR(res == VK_SUCCESS);
    (void)res;
}